

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O1

void Acb_NtkCreateFanout(Acb_Ntk_t *p)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  size_t __size;
  long lVar5;
  long lVar6;
  
  iVar1 = (p->vObjType).nCap;
  if ((p->vFanouts).nCap < iVar1) {
    pVVar3 = (p->vFanouts).pArray;
    __size = (long)iVar1 << 4;
    if (pVVar3 == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc(__size);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(pVVar3,__size);
    }
    (p->vFanouts).pArray = pVVar3;
    lVar5 = (long)(p->vFanouts).nCap;
    memset(pVVar3 + lVar5,0,(iVar1 - lVar5) * 0x10);
    (p->vFanouts).nCap = iVar1;
  }
  (p->vFanouts).nSize = iVar1;
  if (1 < (p->vObjType).nSize) {
    lVar5 = 1;
    do {
      if ((p->vObjType).nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[lVar5] != '\0') {
        if ((p->vObjFans).nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (p->vObjFans).pArray[lVar5];
        lVar6 = (long)iVar1;
        if ((lVar6 < 0) || ((p->vFanSto).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar2 = (p->vFanSto).pArray;
        if (0 < piVar2[lVar6]) {
          lVar4 = 0;
          do {
            iVar1 = piVar2[lVar6 + lVar4 + 1];
            if (((long)iVar1 < 0) || ((p->vFanouts).nSize <= iVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            lVar4 = lVar4 + 1;
            Vec_IntPush((p->vFanouts).pArray + iVar1,(int)lVar5);
          } while (lVar4 < piVar2[lVar6]);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vObjType).nSize);
  }
  return;
}

Assistant:

static inline void Acb_NtkCreateFanout( Acb_Ntk_t * p )
{
    int iObj; 
    Acb_NtkCleanObjFanout( p );
    Acb_NtkForEachObj( p, iObj )
        Acb_ObjAddFaninFanout( p, iObj );
}